

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

void * EvpathReadRemoteMemory
                 (CP_Services Svcs,DP_RS_Stream Stream_v,int Rank,size_t Timestep,size_t Offset,
                 size_t Length,void *Buffer,void *DP_TimestepInfo)

{
  SstPreloadModeType SVar1;
  int iVar2;
  undefined4 uVar3;
  Evpath_RS_Stream RS_Stream;
  ulong in_RCX;
  uint in_EDX;
  Evpath_RS_Stream in_RSI;
  CP_Services in_RDI;
  __pthread_internal_list *in_R8;
  __pthread_internal_list *in_R9;
  bool bVar4;
  undefined8 in_stack_00000008;
  int WaitForData;
  int HadPreload;
  _EvpathReadRequestMsg ReadRequestMsg;
  EvpathCompletionHandle ret;
  CManager cm;
  Evpath_RS_Stream Stream;
  undefined1 local_80 [16];
  size_t in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  Evpath_RS_Stream local_8;
  
  RS_Stream = (Evpath_RS_Stream)(*in_RDI->getCManager)(in_RSI->CP_Stream);
  local_8 = (Evpath_RS_Stream)malloc(0x48);
  pthread_mutex_lock((pthread_mutex_t *)&in_RSI->DataLock);
  if ((EvpathReadRemoteMemory::LastRequestedTimestep != 0xffffffffffffffff) &&
     (EvpathReadRemoteMemory::LastRequestedTimestep != in_RCX)) {
    DiscardPriorPreloaded((CP_Services)in_RSI,RS_Stream,(size_t)local_8);
  }
  EvpathReadRemoteMemory::LastRequestedTimestep = in_RCX;
  iVar2 = HandleRequestWithPreloaded
                    ((CP_Services)RS_Stream,local_8,in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     in_R8);
  local_8->ReadRequestFormat = (CMFormat)in_RSI->CP_Stream;
  (local_8->DataLock).__align = (long)in_RSI;
  (local_8->DataLock).__data.__kind = 0;
  local_8->CP_Stream = RS_Stream;
  *(undefined8 *)((long)&local_8->DataLock + 8) = in_stack_00000008;
  *(uint *)((long)&local_8->DataLock + 0x14) = in_EDX;
  (local_8->DataLock).__data.__list.__prev = in_R8;
  (local_8->DataLock).__data.__list.__next = in_R9;
  in_RSI->TotalReadRequests = in_RSI->TotalReadRequests + 1;
  if (iVar2 == 0) {
    uVar3 = CMCondition_get(RS_Stream,0);
    *(undefined4 *)&local_8->cm = uVar3;
    AddRequestToList(in_RDI,in_RSI,(EvpathCompletionHandle)local_8);
    CMCondition_set_client_data(RS_Stream,*(undefined4 *)&local_8->cm);
    pthread_mutex_unlock((pthread_mutex_t *)&in_RSI->DataLock);
    bVar4 = false;
    SVar1 = in_RSI->CurPreloadMode;
    if (SVar1 != SstPreloadNone) {
      if (SVar1 == SstPreloadSpeculative) {
        bVar4 = in_RSI->PreloadActiveTimestep <= in_RCX;
      }
      else if (SVar1 == SstPreloadLearned) {
        bVar4 = in_RSI->PreloadActiveTimestep < in_RCX;
      }
    }
    if (bVar4) {
      (*in_RDI->verbose)(in_RSI->CP_Stream,5,
                         "Adios waiting for preload data for Timestep %d from Rank %d, WSR_Stream = %p, DP_TimestepInfo %p\n"
                         ,in_RCX,(ulong)in_EDX,in_RSI->WriterContactInfo[(int)in_EDX].WS_Stream,
                         _WaitForData);
    }
    else {
      (*in_RDI->verbose)(in_RSI->CP_Stream,5,
                         "Adios requesting to read remote memory for Timestep %d from Rank %d, WSR_Stream = %p, DP_TimestepInfo %p\n"
                         ,in_RCX,(ulong)in_EDX,in_RSI->WriterContactInfo[(int)in_EDX].WS_Stream,
                         _WaitForData);
      memset(local_80,0,0x30);
      iVar2 = (*in_RDI->sendToPeer)
                        (in_RSI->CP_Stream,in_RSI->PeerCohort,in_EDX,in_RSI->ReadRequestFormat,
                         local_80);
      if (iVar2 == 0) {
        (local_8->DataLock).__data.__kind = 1;
        CMCondition_signal(RS_Stream,*(undefined4 *)&local_8->cm);
      }
    }
  }
  else {
    *(undefined4 *)&local_8->cm = 0xffffffff;
    in_RSI->ReadRequestsFromPreload = in_RSI->ReadRequestsFromPreload + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&in_RSI->DataLock);
  }
  return local_8;
}

Assistant:

static void *EvpathReadRemoteMemory(CP_Services Svcs, DP_RS_Stream Stream_v, int Rank,
                                    size_t Timestep, size_t Offset, size_t Length, void *Buffer,
                                    void *DP_TimestepInfo)
{
    Evpath_RS_Stream Stream =
        (Evpath_RS_Stream)Stream_v; /* DP_RS_Stream is the return from InitReader */
    CManager cm = Svcs->getCManager(Stream->CP_Stream);
    EvpathCompletionHandle ret = malloc(sizeof(struct _EvpathCompletionHandle));
    // EvpathPerTimestepInfo TimestepInfo =
    // (EvpathPerTimestepInfo)DP_TimestepInfo;
    struct _EvpathReadRequestMsg ReadRequestMsg;

    int HadPreload;
    static size_t LastRequestedTimestep = -1;

    pthread_mutex_lock(&Stream->DataLock);
    if ((LastRequestedTimestep != -1) && (LastRequestedTimestep != Timestep))
    {
        DiscardPriorPreloaded(Svcs, Stream, Timestep);
    }
    LastRequestedTimestep = Timestep;
    HadPreload = HandleRequestWithPreloaded(Svcs, Stream, Rank, Timestep, Offset, Length, Buffer);
    ret->CPStream = Stream->CP_Stream;
    ret->DPStream = Stream;
    ret->Failed = 0;
    ret->cm = cm;
    ret->Buffer = Buffer;
    ret->Rank = Rank;
    ret->Offset = Offset;
    ret->Length = Length;

    Stream->TotalReadRequests++;
    if (HadPreload)
    {
        /* cool, we already had the data.  Setup a dummy return handle */
        ret->CMcondition = -1;
        Stream->ReadRequestsFromPreload++;
        pthread_mutex_unlock(&Stream->DataLock);
        return ret;
    }

    ret->CMcondition = CMCondition_get(cm, NULL);

    /*
     * set the completion handle as client Data on the condition so that
     * handler has access to it.
     */
    AddRequestToList(Svcs, Stream, ret);
    CMCondition_set_client_data(cm, ret->CMcondition, ret);
    pthread_mutex_unlock(&Stream->DataLock);
    int WaitForData = 0;
    switch (Stream->CurPreloadMode)
    {
    case SstPreloadNone:
        break;
    case SstPreloadSpeculative:
        if (Timestep >= Stream->PreloadActiveTimestep)
        {
            WaitForData++;
        }
        break;
    case SstPreloadLearned:
        if (Timestep > Stream->PreloadActiveTimestep)
        {
            WaitForData++;
        }
        break;
    }
    if (WaitForData)
    {
        // we're in some kind of preload mode, but we don't have the data yet,
        // wait for it without sending a request
        Svcs->verbose(Stream->CP_Stream, DPTraceVerbose,
                      "Adios waiting for preload data for Timestep %d "
                      "from Rank %d, WSR_Stream = %p, DP_TimestepInfo %p\n",
                      Timestep, Rank, Stream->WriterContactInfo[Rank].WS_Stream, DP_TimestepInfo);
        return ret;
    }
    Svcs->verbose(Stream->CP_Stream, DPTraceVerbose,
                  "Adios requesting to read remote memory for Timestep %d "
                  "from Rank %d, WSR_Stream = %p, DP_TimestepInfo %p\n",
                  Timestep, Rank, Stream->WriterContactInfo[Rank].WS_Stream, DP_TimestepInfo);

    /* send request to appropriate writer */
    /* memset avoids uninit byte warnings from valgrind */
    memset(&ReadRequestMsg, 0, sizeof(ReadRequestMsg));
    ReadRequestMsg.Timestep = Timestep;
    ReadRequestMsg.Offset = Offset;
    ReadRequestMsg.Length = Length;
    ReadRequestMsg.WS_Stream = Stream->WriterContactInfo[Rank].WS_Stream;
    ReadRequestMsg.RS_Stream = Stream;
    ReadRequestMsg.RequestingRank = Stream->Rank;
    ReadRequestMsg.NotifyCondition = ret->CMcondition;
    if (!Svcs->sendToPeer(Stream->CP_Stream, Stream->PeerCohort, Rank, Stream->ReadRequestFormat,
                          &ReadRequestMsg))
    {
        ret->Failed = 1;
        CMCondition_signal(cm, ret->CMcondition);
    }

    return ret;
}